

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask28_24(uint32_t *in,uint32_t *out)

{
  byte bVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar9 [64];
  
  auVar5 = vpmovsxbd_avx(ZEXT416(0x100c0804));
  auVar7 = vpmovsxbd_avx512f(_DAT_001928a0);
  uVar3 = *(ulong *)(in + 0x11);
  auVar15._8_8_ = 0x1800000014;
  auVar15._0_8_ = 0x1800000014;
  auVar17 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 1),auVar5);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(in + 5);
  auVar8 = vinserti32x4_avx512f(ZEXT1664(*(undefined1 (*) [16])(in + 1)),auVar14,1);
  auVar4 = vpsrlvd_avx2(*(undefined1 (*) [16])(in + 9),auVar5);
  auVar5 = vpshufd_avx(auVar14,0x50);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(in + 0xd);
  auVar14 = vpsrlvd_avx2(auVar16,auVar15);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(in[7]));
  auVar10._0_24_ = auVar8._0_24_;
  auVar10._24_4_ = auVar9._24_4_;
  auVar10._28_4_ = auVar8._28_4_;
  auVar10._32_4_ = auVar8._32_4_;
  auVar10._36_4_ = auVar8._36_4_;
  auVar10._40_4_ = auVar8._40_4_;
  auVar10._44_4_ = auVar8._44_4_;
  auVar10._48_4_ = auVar8._48_4_;
  auVar10._52_4_ = auVar8._52_4_;
  auVar10._56_4_ = auVar8._56_4_;
  auVar10._60_4_ = auVar8._60_4_;
  auVar6 = valignd_avx512vl(ZEXT1632(auVar17),ZEXT1632(auVar17),7);
  auVar7 = vpermi2d_avx512f(auVar7,auVar10,ZEXT1664(*(undefined1 (*) [16])(in + 9)));
  auVar8 = vpmovsxbd_avx512f(_DAT_001922d0);
  auVar9 = vpmovsxbq_avx512f(ZEXT816(0x806050403020100));
  auVar7 = vpermi2d_avx512f(auVar8,auVar7,ZEXT864(*(ulong *)(in + 0xd)));
  auVar8 = vpbroadcastd_avx512f(ZEXT416(in[0xf]));
  auVar11._0_52_ = auVar7._0_52_;
  auVar11._52_4_ = auVar8._52_4_;
  auVar11._56_4_ = auVar7._56_4_;
  auVar11._60_4_ = auVar7._60_4_;
  auVar7 = vpermi2q_avx512f(auVar9,auVar11,ZEXT864(uVar3));
  auVar7 = vpsllvd_avx512f(auVar7,_DAT_0019ee00);
  auVar6 = vpblendd_avx2(auVar6,ZEXT432(*in),1);
  auVar17 = vpshufd_avx(auVar15,0x50);
  auVar5 = vpsrlvd_avx2(auVar5,auVar17);
  auVar13._0_16_ = ZEXT116(0) * auVar5 + ZEXT116(1) * auVar4;
  auVar13._16_16_ = ZEXT116(1) * auVar5;
  auVar6 = vpblendd_avx2(auVar6,auVar13,0x60);
  auVar8 = vpbroadcastd_avx512f(ZEXT416(in[8]));
  auVar8 = vinserti32x4_avx512f(ZEXT3264(CONCAT428(auVar8._28_4_,auVar6._0_28_)),auVar4,2);
  auVar8 = vinserti32x4_avx512f(auVar8,auVar14,3);
  auVar9 = vpbroadcastd_avx512f(ZEXT416(in[0x10]));
  auVar12._56_4_ = auVar9._56_4_;
  uVar2 = in[0x17];
  auVar9 = vpbroadcastd_avx512f();
  auVar12._0_56_ = auVar8._0_56_;
  auVar12._60_4_ = auVar9._60_4_;
  bVar1 = *(byte *)((long)in + 0x5b);
  auVar7 = vpord_avx512f(auVar7,auVar12);
  auVar5 = vpmovsxbd_avx(ZEXT416(0x2010005));
  auVar7 = vmovdqu64_avx512f(auVar7);
  *(undefined1 (*) [64])out = auVar7;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar3;
  auVar5 = vpermi2d_avx512vl(auVar5,*(undefined1 (*) [16])(in + 0x13),auVar17);
  auVar17 = vpsrlvd_avx2(auVar5,_DAT_00192850);
  auVar5 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0x13),_DAT_0019d380);
  auVar5 = vpor_avx(auVar5,auVar17);
  *(undefined1 (*) [16])(out + 0x10) = auVar5;
  out[0x14] = uVar2 << 4 | (uint)bVar1;
  return out + 0x15;
}

Assistant:

uint32_t *__fastpackwithoutmask28_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;

  return out;
}